

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  ParseFlags parse_flags_00;
  ParseContext *ctx_00;
  char *ptr;
  BoundedZCIS input_local;
  ParseContext ctx;
  
  ctx_00 = input._8_8_;
  input_local.limit = (int)input.zcis;
  input_local.zcis = (ZeroCopyInputStream *)this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (&ctx,io::CodedInputStream::default_recursion_limit_,true,&ptr,&input_local.zcis,
             &input_local.limit);
  ptr = (char *)(**(code **)((ctx_00->super_EpsCopyInputStream).limit_end_ + 0x50))(ctx_00,ptr,&ctx)
  ;
  if ((ptr != (char *)0x0) &&
     (EpsCopyInputStream::BackUp(&ctx.super_EpsCopyInputStream,ptr),
     ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 0)) {
    bVar1 = anon_unknown_13::CheckFieldPresence
                      (ctx_00,(MessageLite *)((ulong)msg & 0xffffffff),parse_flags_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (PROTOBUF_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}